

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

void __thiscall UniValue::pushKVs(UniValue *this,UniValue obj)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  pointer pUVar4;
  pointer pUVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string key;
  UniValue val;
  pointer pbVar12;
  undefined8 uVar13;
  long *plVar14;
  ulong uVar15;
  UniValue *in_RSI;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  VType VVar19;
  undefined4 in_stack_ffffffffffffff54;
  long *plVar20;
  long lVar21;
  undefined8 in_stack_ffffffffffffff70;
  pointer pUVar22;
  long local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  size_type local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  checkType(this,(VType *)&stack0xffffffffffffff4c);
  VVar19 = VOBJ;
  checkType(in_RSI,(VType *)&stack0xffffffffffffff4c);
  pbVar12 = (in_RSI->keys).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((in_RSI->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar12) {
    lVar16 = 0x10;
    lVar17 = 0;
    uVar18 = 0;
    do {
      pUVar22 = (pointer)&stack0xffffffffffffffb8;
      pUVar5 = (pointer)((long)&(pbVar12->_M_dataplus)._M_p + lVar16);
      pUVar4 = *(pointer *)((long)pbVar12 + lVar16 + -0x10);
      if (pUVar5 == pUVar4) {
        local_48 = *(long *)pUVar5;
        uStack_40 = *(undefined4 *)&(pUVar5->val)._M_dataplus._M_p;
        uStack_3c = *(undefined4 *)((long)&(pUVar5->val)._M_dataplus._M_p + 4);
      }
      else {
        local_48 = *(long *)pUVar5;
        pUVar22 = pUVar4;
      }
      *(pointer *)((long)pbVar12 + lVar16 + -0x10) = pUVar5;
      *(undefined8 *)((long)pbVar12 + lVar16 + -8) = 0;
      *(undefined1 *)((long)&(pbVar12->_M_dataplus)._M_p + lVar16) = 0;
      pUVar5 = (in_RSI->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = ((long)(in_RSI->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pUVar5 >> 3) *
               0x2e8ba2e8ba2e8ba3;
      if (uVar15 < uVar18 || uVar15 - uVar18 == 0) {
        if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar13 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,uVar18);
          if (pUVar22 != (pointer)&stack0xffffffffffffffb8) {
            operator_delete(pUVar22,local_48 + 1);
          }
          if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar13);
          }
        }
        goto LAB_007d9cb5;
      }
      puVar1 = (undefined4 *)((long)&pUVar5->typ + lVar17);
      plVar14 = (long *)(puVar1 + 6);
      uVar3 = *puVar1;
      if (plVar14 == *(long **)(puVar1 + 2)) {
        lVar21 = *plVar14;
        in_stack_ffffffffffffff70 = *(undefined8 *)(puVar1 + 8);
        plVar20 = (long *)&stack0xffffffffffffff68;
      }
      else {
        lVar21 = *plVar14;
        plVar20 = *(long **)(puVar1 + 2);
      }
      uVar13 = *(undefined8 *)((long)&(pUVar5->val)._M_string_length + lVar17);
      *(long **)((long)&(pUVar5->val)._M_dataplus._M_p + lVar17) = plVar14;
      *(undefined8 *)((long)&(pUVar5->val)._M_string_length + lVar17) = 0;
      (pUVar5->val).field_2._M_local_buf[lVar17] = '\0';
      puVar2 = (undefined8 *)
               ((long)&(pUVar5->keys).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + lVar17);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      uVar6 = *(undefined8 *)
               ((long)&(pUVar5->keys).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + lVar17 + 0x10);
      *(undefined8 *)
       ((long)&(pUVar5->keys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl + lVar17 + 0x10) = 0;
      puVar2 = (undefined8 *)
               ((long)&(pUVar5->keys).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + lVar17);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)
               ((long)&(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl + lVar17);
      uVar10 = *puVar2;
      uVar11 = puVar2[1];
      uVar7 = *(undefined8 *)
               ((long)&(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl + lVar17 + 0x10);
      *(undefined8 *)
       ((long)&(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl +
       lVar17 + 0x10) = 0;
      puVar2 = (undefined8 *)
               ((long)&(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl + lVar17);
      *puVar2 = 0;
      puVar2[1] = 0;
      key._M_string_length = (size_type)this;
      key._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38;
      key.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff48;
      key.field_2._M_allocated_capacity._4_4_ = VVar19;
      key.field_2._8_4_ = uVar3;
      key.field_2._12_4_ = in_stack_ffffffffffffff54;
      val.val._M_dataplus._M_p = (pointer)uVar13;
      val._0_8_ = plVar20;
      val.val._M_string_length = lVar21;
      val.val.field_2._M_allocated_capacity = in_stack_ffffffffffffff70;
      val.val.field_2._8_8_ = uVar8;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar9;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar6;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar10;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)uVar11;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)uVar7;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pUVar22;
      pushKVEnd(this,key,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffff90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff78);
      if (plVar20 != (long *)&stack0xffffffffffffff68) {
        operator_delete(plVar20,lVar21 + 1);
      }
      if (pUVar22 != (pointer)&stack0xffffffffffffffb8) {
        operator_delete(pUVar22,local_48 + 1);
      }
      uVar18 = uVar18 + 1;
      pbVar12 = (in_RSI->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x20;
      lVar17 = lVar17 + 0x58;
    } while (uVar18 < (ulong)((long)(in_RSI->keys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5)
            );
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_007d9cb5:
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKVs(UniValue obj)
{
    checkType(VOBJ);
    obj.checkType(VOBJ);

    for (size_t i = 0; i < obj.keys.size(); i++)
        pushKVEnd(std::move(obj.keys.at(i)), std::move(obj.values.at(i)));
}